

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ircode.c
# Opt level: O0

void ircode_register_dump(ircode_t *code)

{
  uint uVar1;
  uint local_18;
  uint32_t value;
  uint32_t i;
  uint32_t n;
  ircode_t *code_local;
  
  uVar1 = (uint)(code->registers).n;
  if (uVar1 == 0) {
    printf("EMPTY\n");
  }
  for (local_18 = 0; local_18 < uVar1; local_18 = local_18 + 1) {
    printf("[%d]\t%d\n",(ulong)local_18,(ulong)(code->registers).p[local_18]);
  }
  return;
}

Assistant:

void ircode_register_dump (ircode_t *code) {
    uint32_t n = (uint32_t)marray_size(code->registers);
    if (n == 0) printf("EMPTY\n");
    for (uint32_t i=0; i<n; ++i) {
        uint32_t value = marray_get(code->registers, i);
        printf("[%d]\t%d\n", i, value);
    }
}